

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_object.cpp
# Opt level: O1

string __thiscall mjs::function_object::to_string(function_object *this)

{
  gc_heap *h;
  gc_string *pgVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  long in_RSI;
  string sVar3;
  wostringstream oss;
  long *local_1c8;
  long local_1b8 [2];
  wstring_view local_1a8;
  gc_heap local_198;
  ios_base local_128 [264];
  
  h = *(gc_heap **)(in_RSI + 8);
  if (*(char *)(in_RSI + 0x44) == '\x01') {
    std::__cxx11::wostringstream::wostringstream((wostringstream *)&local_198);
    std::operator<<((wostream *)&local_198,"function ");
    if (*(int *)(in_RSI + 0x30) != 0) {
      pgVar1 = gc_heap_ptr_untracked<mjs::gc_string,_true>::dereference
                         ((gc_heap_ptr_untracked<mjs::gc_string,_true> *)(in_RSI + 0x30),h);
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                ((wostream *)&local_198,(wchar_t *)(pgVar1 + 1),(ulong)pgVar1->length_);
    }
    std::operator<<((wostream *)&local_198,"() { [native code] }");
    std::__cxx11::wstringbuf::str();
    string::string((string *)this,h,&local_1a8);
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8,local_1b8[0] * 4 + 4);
    }
    std::__cxx11::wostringstream::~wostringstream((wostringstream *)&local_198);
    std::ios_base::~ios_base(local_128);
    uVar2 = extraout_RDX;
  }
  else {
    gc_heap::unsafe_create_from_position<mjs::gc_string>(&local_198,(uint32_t)h);
    (this->super_native_object).super_object._vptr_object = (_func_int **)local_198.pointers_.set_;
    *(uint32_t *)&(this->super_native_object).super_object.heap_ = local_198.pointers_.capacity_;
    if ((gc_heap *)local_198.pointers_.set_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_198.pointers_.set_,(gc_heap_ptr_untyped *)this);
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_198);
    uVar2 = extraout_RDX_00;
  }
  sVar3.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = uVar2;
  sVar3.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (string)sVar3.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
}

Assistant:

string function_object::to_string() const {
    auto& h = heap();
    if (is_native_) {
        std::wostringstream oss;
        oss << "function ";
        if (text_) {
            oss << text_.dereference(h).view();
        }
        oss << "() { [native code] }";
        return string{h, oss.str()};
    } else {
        return text_.track(h);
    }
}